

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

int oSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **oDep,Vec_Int_t **oMatch,int *oGroup,int *oLastItem,
               int *iGroup)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar2;
  int encode;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int iVar6;
  int local_64;
  
  local_64 = 0;
  for (lVar5 = 0; lVar5 < *oLastItem; lVar5 = lVar5 + 1) {
    if (oMatch[lVar5]->nSize != 1) {
      p = Vec_IntAlloc(oMatch[lVar5]->nSize);
      p_00 = Vec_IntAlloc(oMatch[lVar5]->nSize);
      iVar6 = 0;
      while( true ) {
        pVVar4 = oMatch[lVar5];
        if (pVVar4->nSize <= iVar6) break;
        iVar2 = 0;
        iVar3 = 0;
        while( true ) {
          iVar1 = Vec_IntEntry(pVVar4,iVar6);
          if (oDep[iVar1]->nSize <= iVar2) break;
          iVar1 = Vec_IntEntry(oMatch[lVar5],iVar6);
          iVar1 = Vec_IntEntry(oDep[iVar1],iVar2);
          iVar3 = iVar3 + iGroup[iVar1];
          iVar2 = iVar2 + 1;
          pVVar4 = oMatch[lVar5];
        }
        Vec_IntPush(p,iVar3);
        Vec_IntPushUniqueOrder(p_00,iVar3);
        if (iVar3 < 0) {
          printf("WARNING! Integer overflow!");
        }
        iVar6 = iVar6 + 1;
      }
      while (1 < p_00->nSize) {
        for (iVar6 = 0; iVar6 < oMatch[lVar5]->nSize; iVar6 = iVar6 + 1) {
          iVar2 = Vec_IntEntry(p,iVar6);
          iVar3 = Vec_IntEntryLast(p_00);
          if (iVar2 == iVar3) {
            pVVar4 = oMatch[(long)local_64 + (long)*oLastItem];
            iVar2 = Vec_IntEntry(oMatch[lVar5],iVar6);
            Vec_IntPush(pVVar4,iVar2);
            iVar2 = *oLastItem;
            iVar3 = Vec_IntEntry(oMatch[lVar5],iVar6);
            oGroup[iVar3] = iVar2 + local_64;
            pVVar4 = oMatch[lVar5];
            iVar2 = Vec_IntEntry(pVVar4,iVar6);
            Vec_IntRemove(pVVar4,iVar2);
            iVar2 = Vec_IntEntry(p,iVar6);
            Vec_IntRemove(p,iVar2);
            iVar6 = iVar6 + -1;
          }
        }
        local_64 = local_64 + 1;
        Vec_IntPop(p_00);
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
    }
  }
  *oLastItem = *oLastItem + local_64;
  return local_64;
}

Assistant:

int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup)
{
    int i, j, k;
    int numOfItemsAdded;
    Vec_Int_t * array, * sortedArray;    

    numOfItemsAdded = 0;

    for(i = 0; i < *oLastItem; i++)
    {
        if(Vec_IntSize(oMatch[i]) == 1)
            continue;

        array = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );

        for(j = 0; j < Vec_IntSize(oMatch[i]); j++)
        {
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(oDep[Vec_IntEntry(oMatch[i], j)]); k++)                                        
                encode += iGroup[Vec_IntEntry(oDep[Vec_IntEntry(oMatch[i], j)], k)] * factor;                        
            
            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);

            if( encode < 0)
                printf("WARNING! Integer overflow!");

            //printf("%d ", Vec_IntEntry(array, j));
        }                
        
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(oMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(oMatch[*oLastItem+numOfItemsAdded], Vec_IntEntry(oMatch[i], k));
                    oGroup[Vec_IntEntry(oMatch[i], k)] = *oLastItem+numOfItemsAdded;
                    Vec_IntRemove( oMatch[i], Vec_IntEntry(oMatch[i], k) );        
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );            
                    k--;
                }    
            }            
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);                        
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );        
        //printf("\n");
    }    

    *oLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *oLastItem ; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;
}